

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  ulong *puVar2;
  undefined4 *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar15;
  int iVar16;
  __m128i *palVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  __m128i *palVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar39;
  undefined1 auVar38 [16];
  undefined4 uVar40;
  undefined4 uVar42;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i_64_t B;
  undefined1 auVar46 [16];
  longlong lVar47;
  undefined1 auVar48 [16];
  int64_t iVar49;
  __m128i_64_t B_2;
  undefined1 auVar50 [16];
  ulong uVar52;
  undefined1 auVar51 [16];
  __m128i_64_t B_5;
  ulong uVar53;
  ulong uVar54;
  undefined1 auVar55 [16];
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  __m128i_64_t B_1;
  ulong uVar59;
  __m128i_64_t e;
  __m128i_64_t h;
  int local_110;
  int local_108;
  ulong local_f0;
  longlong local_58 [5];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar5 = (profile->profile64).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_1();
        }
        else {
          iVar12 = uVar4 - 1;
          uVar30 = (ulong)uVar4 + 1;
          uVar32 = uVar30 >> 1;
          uVar31 = (uint)uVar32;
          iVar13 = iVar12 / (int)uVar31;
          iVar34 = -open;
          iVar18 = ppVar6->min;
          uVar33 = 0x8000000000000000 - (long)iVar18;
          if (iVar18 != iVar34 && SBORROW4(iVar18,iVar34) == iVar18 + open < 0) {
            uVar33 = (ulong)(uint)open | 0x8000000000000000;
          }
          iVar18 = ppVar6->max;
          ppVar14 = parasail_result_new_rowcol1((uint)uVar30 & 0x7ffffffe,s2Len);
          if (ppVar14 != (parasail_result_t *)0x0) {
            ppVar14->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar14->flag | 0x2840402;
            ptr = parasail_memalign___m128i(0x10,uVar32);
            ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar32);
            ptr_02 = parasail_memalign___m128i(0x10,uVar32);
            ptr_03 = parasail_memalign___m128i(0x10,uVar32);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar15 = s2Len + -1;
              iVar16 = 1 - iVar13;
              uVar35 = (ulong)(uint)open;
              uVar37 = (ulong)(uint)gap;
              local_f0 = uVar33 + 1;
              lVar19 = 0x7ffffffffffffffe - (long)iVar18;
              uVar40 = (undefined4)local_f0;
              uVar42 = (undefined4)(local_f0 >> 0x20);
              auVar45._8_4_ = (int)lVar19;
              auVar45._0_8_ = lVar19;
              auVar45._12_4_ = (int)((ulong)lVar19 >> 0x20);
              auVar43._0_8_ = (long)iVar16;
              auVar43._8_4_ = iVar16;
              auVar43._12_4_ = iVar16 >> 0x1f;
              lVar20 = (long)iVar34;
              uVar24 = 0;
              do {
                lVar26 = 0;
                lVar25 = lVar20;
                do {
                  lVar27 = lVar25;
                  if (s1_beg != 0) {
                    lVar27 = 0;
                  }
                  local_58[lVar26 + 2] = lVar27;
                  local_58[lVar26] = lVar27 - (ulong)(uint)open;
                  lVar26 = lVar26 + 1;
                  lVar25 = lVar25 - uVar32 * (uint)gap;
                } while (lVar26 == 1);
                ptr_02[uVar24][0] = local_58[2];
                ptr_02[uVar24][1] = local_58[3];
                ptr[uVar24][0] = local_58[0];
                ptr[uVar24][1] = local_58[1];
                uVar24 = uVar24 + 1;
                lVar20 = lVar20 - (ulong)(uint)gap;
              } while (uVar24 != uVar32);
              *ptr_00 = 0;
              uVar24 = 1;
              do {
                iVar18 = 0;
                if (s2_beg == 0) {
                  iVar18 = iVar34;
                }
                ptr_00[uVar24] = (long)iVar18;
                uVar24 = uVar24 + 1;
                iVar34 = iVar34 - gap;
              } while (s2Len + 1 != uVar24);
              lVar20 = -uVar35;
              uVar36 = (ulong)(uint)open;
              lVar25 = -uVar36;
              palVar21 = ptr_03 + (uVar31 - 1);
              uVar24 = uVar32;
              do {
                (*palVar21)[0] = lVar20;
                (*palVar21)[1] = lVar25;
                lVar20 = lVar20 - uVar37;
                uVar39 = (ulong)(uint)gap;
                lVar25 = lVar25 - uVar39;
                lVar26 = lVar20;
                if (auVar45._0_8_ < lVar20) {
                  lVar26 = auVar45._0_8_;
                }
                lVar27 = lVar25;
                if (auVar45._8_8_ < lVar25) {
                  lVar27 = auVar45._8_8_;
                }
                auVar45._8_8_ = lVar27;
                auVar45._0_8_ = lVar26;
                palVar21 = palVar21 + -1;
                iVar18 = (int)uVar24;
                uVar23 = iVar18 - 1;
                uVar24 = (ulong)uVar23;
              } while (uVar23 != 0 && 0 < iVar18);
              palVar21 = ptr_02 + (uVar31 - 1);
              palVar17 = ptr_02 + (uint)(iVar12 % (int)uVar31);
              uVar24 = 1;
              if (1 < s2Len) {
                uVar24 = (ulong)(uint)s2Len;
              }
              lVar20 = (ulong)(uVar31 + (uVar31 == 0)) << 4;
              auVar44._0_8_ = -(ulong)(auVar43._0_8_ == 1);
              auVar44._8_8_ = -(ulong)(auVar43._8_8_ == 0);
              auVar48._8_4_ = uVar40;
              auVar48._0_8_ = local_f0;
              auVar48._12_4_ = uVar42;
              auVar46._8_4_ = uVar40;
              auVar46._0_8_ = local_f0;
              auVar46._12_4_ = uVar42;
              uVar22 = 0;
              local_110 = iVar15;
              do {
                auVar50._8_4_ = (int)(*palVar21)[0];
                auVar50._0_8_ = (*palVar21)[0];
                auVar50._12_4_ = *(undefined4 *)((long)*palVar21 + 4);
                iVar18 = ppVar6->mapper[(byte)s2[uVar22]];
                auVar8._8_4_ = uVar40;
                auVar8._0_8_ = local_f0;
                auVar8._12_4_ = uVar42;
                uVar53 = local_f0 - (*ptr_03)[0];
                uVar54 = auVar8._8_8_ - (*ptr_03)[1];
                lVar26 = 0;
                auVar55._8_4_ = uVar40;
                auVar55._0_8_ = local_f0;
                auVar55._12_4_ = uVar42;
                iVar49 = ptr_00[uVar22];
                lVar25 = auVar50._8_8_;
                do {
                  plVar1 = (long *)((long)*ptr_02 + lVar26);
                  lVar27 = *plVar1;
                  lVar10 = plVar1[1];
                  plVar1 = (long *)((long)*ptr + lVar26);
                  uVar56 = *plVar1 - uVar37;
                  uVar57 = plVar1[1] - uVar39;
                  uVar58 = lVar27 - uVar35;
                  uVar59 = lVar10 - uVar36;
                  if ((long)uVar58 < (long)uVar56) {
                    uVar58 = uVar56;
                  }
                  if ((long)uVar59 < (long)uVar57) {
                    uVar59 = uVar57;
                  }
                  plVar1 = (long *)((long)pvVar5 + lVar26 + (long)iVar18 * (long)(int)uVar31 * 0x10)
                  ;
                  uVar57 = iVar49 + *plVar1;
                  uVar52 = lVar25 + plVar1[1];
                  plVar1 = (long *)((long)*ptr_03 + lVar26);
                  uVar56 = uVar53 + *plVar1;
                  lVar25 = uVar54 + plVar1[1];
                  if ((long)uVar56 < (long)auVar55._0_8_) {
                    uVar56 = auVar55._0_8_;
                  }
                  if (lVar25 < auVar55._8_8_) {
                    lVar25 = auVar55._8_8_;
                  }
                  uVar53 = uVar58;
                  if ((long)uVar58 <= (long)uVar57) {
                    uVar53 = uVar57;
                  }
                  uVar54 = uVar59;
                  if ((long)uVar59 <= (long)uVar52) {
                    uVar54 = uVar52;
                  }
                  auVar55._8_8_ = lVar25;
                  auVar55._0_8_ = uVar56;
                  puVar2 = (ulong *)((long)*ptr + lVar26);
                  *puVar2 = uVar58;
                  puVar2[1] = uVar59;
                  puVar2 = (ulong *)((long)*ptr_01 + lVar26);
                  *puVar2 = uVar53;
                  puVar2[1] = uVar54;
                  lVar26 = lVar26 + 0x10;
                  iVar49 = lVar27;
                  lVar25 = lVar10;
                } while (lVar20 != lVar26);
                uVar54 = ptr_00[uVar22 + 1];
                uVar58 = (*ptr_03)[0] + uVar54;
                if ((long)uVar58 < (long)uVar56) {
                  uVar58 = uVar56;
                }
                uVar59 = local_f0;
                if ((long)local_f0 < (long)uVar54) {
                  uVar59 = uVar54;
                }
                uVar56 = uVar22 + 1;
                uVar54 = uVar58;
                if ((long)uVar58 < (long)uVar53) {
                  uVar54 = uVar53;
                }
                lVar25 = 0;
                uVar53 = local_f0;
                do {
                  uVar57 = uVar53 - uVar37;
                  uVar52 = uVar58 - uVar39;
                  uVar53 = uVar59 - uVar35;
                  if ((long)(uVar59 - uVar35) < (long)uVar57) {
                    uVar53 = uVar57;
                  }
                  uVar58 = uVar54 - uVar36;
                  if ((long)(uVar54 - uVar36) < (long)uVar52) {
                    uVar58 = uVar52;
                  }
                  uVar59 = *(ulong *)((long)*ptr_01 + lVar25);
                  if ((long)uVar59 <= (long)uVar53) {
                    uVar59 = uVar53;
                  }
                  uVar54 = *(ulong *)((long)*ptr_01 + lVar25 + 8);
                  if ((long)uVar54 <= (long)uVar58) {
                    uVar54 = uVar58;
                  }
                  uVar57 = auVar45._0_8_;
                  if ((long)uVar59 <= (long)auVar45._0_8_) {
                    uVar57 = uVar59;
                  }
                  uVar52 = auVar45._8_8_;
                  if ((long)uVar54 <= (long)auVar45._8_8_) {
                    uVar52 = uVar54;
                  }
                  puVar2 = (ulong *)((long)*ptr_02 + lVar25);
                  *puVar2 = uVar59;
                  puVar2[1] = uVar54;
                  if ((long)uVar53 <= (long)uVar57) {
                    uVar57 = uVar53;
                  }
                  if ((long)uVar58 <= (long)uVar52) {
                    uVar52 = uVar58;
                  }
                  auVar45._8_8_ = uVar52;
                  auVar45._0_8_ = uVar57;
                  uVar29 = uVar59;
                  if ((long)uVar59 < (long)auVar46._0_8_) {
                    uVar29 = auVar46._0_8_;
                  }
                  uVar28 = uVar54;
                  if ((long)uVar54 < (long)auVar46._8_8_) {
                    uVar28 = auVar46._8_8_;
                  }
                  auVar46._8_8_ = uVar28;
                  auVar46._0_8_ = uVar29;
                  lVar25 = lVar25 + 0x10;
                } while (lVar20 != lVar25);
                lVar25 = (*palVar17)[0];
                uVar53 = (*palVar17)[1];
                lVar26 = auVar48._0_8_;
                uVar58 = auVar48._8_8_;
                uVar54 = uVar58;
                if ((long)uVar58 < (long)uVar53) {
                  uVar54 = uVar53;
                }
                lVar27 = lVar26;
                if (lVar26 < lVar25) {
                  lVar27 = lVar25;
                }
                auVar51._8_8_ = -(ulong)((long)uVar58 < (long)uVar53);
                auVar51._0_8_ = -(ulong)(lVar26 < lVar25);
                auVar51 = auVar51 & auVar44;
                local_108 = (int)uVar22;
                if ((((((((((((((((auVar51 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar51 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar51 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar51 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar51 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar51 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar51 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar51 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar51 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar51 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar51 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar51 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar51[0xf] < '\0') {
                  local_110 = local_108;
                }
                lVar47 = (*palVar17)[0];
                iVar18 = (int)(*palVar17)[1];
                if (iVar13 < 1) {
                  do {
                    iVar18 = (int)lVar47;
                    lVar47 = 0;
                  } while (iVar13 < 0);
                }
                ((ppVar14->field_4).rowcols)->score_row[uVar22] = iVar18;
                auVar48._8_8_ = uVar54;
                auVar48._0_8_ = lVar27;
                uVar22 = uVar56;
              } while (uVar56 != uVar24);
              lVar20 = 0;
              do {
                puVar3 = (undefined4 *)((long)*ptr_02 + lVar20 * 4);
                uVar40 = puVar3[2];
                piVar7 = ((ppVar14->field_4).rowcols)->score_col;
                *(undefined4 *)((long)piVar7 + lVar20) = *puVar3;
                *(undefined4 *)((long)piVar7 + uVar32 * 4 + lVar20) = uVar40;
                lVar20 = lVar20 + 4;
              } while ((ulong)(uVar31 + (uVar31 == 0)) << 2 != lVar20);
              if ((s2_end != 0) && (local_f0 = uVar54, iVar13 < 1)) {
                do {
                  local_f0 = auVar48._0_8_;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = local_f0;
                  auVar48 = auVar9 << 0x40;
                } while (iVar13 < 0);
              }
              iVar18 = iVar12;
              if ((s1_end != 0) && ((uVar30 & 0x7ffffffe) != 0)) {
                uVar30 = 0;
                do {
                  uVar23 = 0;
                  if ((uVar30 & 1) != 0) {
                    uVar23 = uVar31;
                  }
                  iVar34 = uVar23 + ((uint)(uVar30 >> 1) & 0x7fffffff);
                  iVar16 = iVar18;
                  iVar11 = local_110;
                  uVar32 = local_f0;
                  if ((iVar34 < (int)uVar4) &&
                     (uVar24 = (*ptr_02)[uVar30], iVar16 = iVar34, iVar11 = iVar15, uVar32 = uVar24,
                     (long)uVar24 <= (long)local_f0)) {
                    if (iVar18 <= iVar34) {
                      iVar34 = iVar18;
                    }
                    if (local_110 != iVar15) {
                      iVar34 = iVar18;
                    }
                    iVar16 = iVar18;
                    iVar11 = local_110;
                    uVar32 = local_f0;
                    if (uVar24 == local_f0) {
                      iVar16 = iVar34;
                    }
                  }
                  local_f0 = uVar32;
                  local_110 = iVar11;
                  iVar18 = iVar16;
                  uVar30 = uVar30 + 1;
                } while ((uVar31 & 0x3fffffff) * 2 != (int)uVar30);
              }
              if (s2_end == 0 && s1_end == 0) {
                lVar47 = ptr_02[(uint)(iVar12 % (int)uVar31)][0];
                local_f0._0_4_ = (int)ptr_02[(uint)(iVar12 % (int)uVar31)][1];
                iVar18 = iVar12;
                local_110 = iVar15;
                if (iVar13 < 1) {
                  do {
                    local_f0._0_4_ = (int)lVar47;
                    lVar47 = 0;
                  } while (iVar13 < 0);
                }
              }
              auVar38._8_8_ = -(ulong)((long)uVar52 <= (long)uVar33);
              auVar38._0_8_ = -(ulong)((long)uVar57 <= (long)uVar33);
              auVar41._8_8_ = -(ulong)(lVar19 < (long)uVar28);
              auVar41._0_8_ = -(ulong)(lVar19 < (long)uVar29);
              auVar41 = auVar41 | auVar38;
              if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar41 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar41 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar41 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar41 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar41 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar41 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar41 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar41 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar41 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar41 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar41[0xf] < '\0') {
                *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                local_f0._0_4_ = 0;
                local_110 = 0;
                iVar18 = 0;
              }
              ppVar14->score = (int)local_f0;
              ppVar14->end_query = iVar18;
              ppVar14->end_ref = local_110;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar14;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}